

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckTypeIndex
          (ScriptValidator *this,Location *loc,Type actual,Type expected,char *desc,Index index,
          char *index_kind)

{
  Result RVar1;
  Type expected_local;
  Type actual_local;
  string local_70;
  string local_50;
  
  expected_local = expected;
  actual_local = actual;
  RVar1 = TypeChecker::CheckType(actual,expected);
  if (RVar1.enum_ == Error) {
    Type::GetName_abi_cxx11_(&local_70,&actual_local);
    Type::GetName_abi_cxx11_(&local_50,&expected_local);
    PrintError(this,loc,"type mismatch for %s %u of %s. got %s, expected %s",index_kind,index,desc,
               local_70._M_dataplus._M_p,local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void ScriptValidator::CheckTypeIndex(const Location* loc,
                                     Type actual,
                                     Type expected,
                                     const char* desc,
                                     Index index,
                                     const char* index_kind) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc,
               "type mismatch for %s %" PRIindex " of %s. got %s, expected %s",
               index_kind, index, desc, actual.GetName().c_str(),
               expected.GetName().c_str());
  }
}